

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

double __thiscall llvm::APInt::trunc(APInt *this,double __x)

{
  uint numWords;
  uint64_t *puVar1;
  sbyte sVar2;
  uint in_EDX;
  APInt *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  uint local_24;
  uint bits;
  uint i;
  uint width_local;
  APInt *this_local;
  APInt *Result;
  
  if (in_RSI->BitWidth <= in_EDX) {
    __assert_fail("width < BitWidth && \"Invalid APInt Truncate request\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x332,"APInt llvm::APInt::trunc(unsigned int) const");
  }
  if (in_EDX != 0) {
    if (in_EDX < 0x41) {
      puVar1 = getRawData(in_RSI);
      APInt(this,in_EDX,*puVar1,false);
      dVar3 = extraout_XMM0_Qa;
    }
    else {
      numWords = getNumWords(in_EDX);
      puVar1 = getMemory(numWords);
      APInt(this,puVar1,in_EDX);
      for (local_24 = 0; local_24 != in_EDX >> 6; local_24 = local_24 + 1) {
        (this->U).pVal[local_24] = (in_RSI->U).pVal[local_24];
      }
      dVar3 = extraout_XMM0_Qa_00;
      if ((-in_EDX & 0x3f) != 0) {
        sVar2 = (sbyte)(-in_EDX & 0x3f);
        (this->U).pVal[local_24] = ((in_RSI->U).pVal[local_24] << sVar2) >> sVar2;
      }
    }
    return dVar3;
  }
  __assert_fail("width && \"Can\'t truncate to 0 bits\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x333,"APInt llvm::APInt::trunc(unsigned int) const");
}

Assistant:

APInt APInt::trunc(unsigned width) const {
  assert(width < BitWidth && "Invalid APInt Truncate request");
  assert(width && "Can't truncate to 0 bits");

  if (width <= APINT_BITS_PER_WORD)
    return APInt(width, getRawData()[0]);

  APInt Result(getMemory(getNumWords(width)), width);

  // Copy full words.
  unsigned i;
  for (i = 0; i != width / APINT_BITS_PER_WORD; i++)
    Result.U.pVal[i] = U.pVal[i];

  // Truncate and copy any partial word.
  unsigned bits = (0 - width) % APINT_BITS_PER_WORD;
  if (bits != 0)
    Result.U.pVal[i] = U.pVal[i] << bits >> bits;

  return Result;
}